

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

double xmlXPathPopNumber(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr val;
  xmlXPathParserContextPtr local_28;
  double ret;
  xmlXPathObjectPtr obj;
  xmlXPathParserContextPtr ctxt_local;
  
  val = valuePop(ctxt);
  if (val == (xmlXPathObjectPtr)0x0) {
    xmlXPatherror(ctxt,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                  ,0xb97,10);
    if (ctxt != (xmlXPathParserContextPtr)0x0) {
      ctxt->error = 10;
    }
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else {
    if (val->type == XPATH_NUMBER) {
      local_28 = (xmlXPathParserContextPtr)val->floatval;
    }
    else {
      local_28 = (xmlXPathParserContextPtr)xmlXPathCastToNumber(val);
    }
    xmlXPathReleaseObject(ctxt->context,val);
    ctxt_local = local_28;
  }
  return (double)ctxt_local;
}

Assistant:

double
xmlXPathPopNumber (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    double ret;

    obj = valuePop(ctxt);
    if (obj == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(0);
    }
    if (obj->type != XPATH_NUMBER)
	ret = xmlXPathCastToNumber(obj);
    else
        ret = obj->floatval;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}